

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

function<void_(Pipeline_*)> *
provide_data(function<void_(Pipeline_*)> *__return_storage_ptr__,shared_ptr<InputSource> *is,
            qpdf_offset_t start,qpdf_offset_t end)

{
  anon_class_32_3_46068ca9 local_48;
  qpdf_offset_t local_28;
  qpdf_offset_t end_local;
  qpdf_offset_t start_local;
  shared_ptr<InputSource> *is_local;
  
  local_28 = end;
  end_local = start;
  start_local = (qpdf_offset_t)is;
  is_local = (shared_ptr<InputSource> *)__return_storage_ptr__;
  std::shared_ptr<InputSource>::shared_ptr(&local_48.is,is);
  local_48.start = end_local;
  local_48.end = local_28;
  std::function<void(Pipeline*)>::
  function<provide_data(std::shared_ptr<InputSource>,long_long,long_long)::__0,void>
            ((function<void(Pipeline*)> *)__return_storage_ptr__,&local_48);
  provide_data(std::shared_ptr<InputSource>,long_long,long_long)::$_0::~__0((__0 *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(Pipeline*)>
provide_data(std::shared_ptr<InputSource> is, qpdf_offset_t start, qpdf_offset_t end)
{
    return [is, start, end](Pipeline* p) {
        Pl_Base64 decode("base64-decode", p, Pl_Base64::a_decode);
        p = &decode;
        size_t bytes = QIntC::to_size(end - start);
        char buf[8192];
        is->seek(start, SEEK_SET);
        size_t len = 0;
        while ((len = is->read(buf, std::min(bytes, sizeof(buf)))) > 0) {
            p->write(buf, len);
            bytes -= len;
            if (bytes == 0) {
                break;
            }
        }
        decode.finish();
    };
}